

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4s.c
# Opt level: O1

int inputToBuffer(roslz4_stream *str)

{
  int iVar1;
  void *pvVar2;
  XXH_errorcode XVar3;
  int iVar4;
  int len;
  
  iVar1 = str->input_left;
  iVar4 = 0;
  if (iVar1 != 0) {
    pvVar2 = str->state;
    len = *(int *)((long)pvVar2 + 0x18) - *(int *)((long)pvVar2 + 0x1c);
    iVar4 = 0;
    if (len != 0) {
      if (iVar1 < len) {
        len = iVar1;
      }
      XVar3 = XXH32_update(*(void **)((long)pvVar2 + 0x28),str->input_next,len);
      iVar4 = -1;
      if (XVar3 != XXH_ERROR) {
        memcpy((void *)((long)*(int *)((long)pvVar2 + 0x1c) + *(long *)((long)pvVar2 + 0x10)),
               str->input_next,(long)len);
        str->input_next = str->input_next + len;
        str->input_left = str->input_left - len;
        str->total_in = str->total_in + len;
        *(int *)((long)pvVar2 + 0x1c) = *(int *)((long)pvVar2 + 0x1c) + len;
        iVar4 = len;
      }
    }
  }
  return iVar4;
}

Assistant:

int inputToBuffer(roslz4_stream *str) {
  stream_state *state = str->state;
  if (str->input_left == 0 ||
      state->buffer_size == state->buffer_offset) {
    return 0;
  }
  int buffer_left = state->buffer_size - state->buffer_offset;
  int to_copy = min(str->input_left, buffer_left);

  int ret = XXH32_update(state->xxh32_state, str->input_next, to_copy);
  if (ret == XXH_ERROR) { return ROSLZ4_ERROR; }

  memcpy(state->buffer + state->buffer_offset, str->input_next, to_copy);
  advanceInput(str, to_copy);
  state->buffer_offset += to_copy;

  DEBUG("inputToBuffer() Wrote % 5i bytes to buffer (size=% 5i)\n",
        to_copy, state->buffer_offset);
  return to_copy;
}